

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O0

void __thiscall spirv_cross::CompilerMSL::emit_mesh_entry_point(CompilerMSL *this)

{
  uint32_t id;
  SmallVector<spirv_cross::TypedID<(spirv_cross::Types)6>,_8UL> *this_00;
  size_type sVar1;
  mapped_type *pmVar2;
  mapped_type *this_01;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *this_02;
  __enable_if_t<is_constructible<value_type,_pair<unsigned_int,_SPIREntryPoint>_&&>::value,_pair<iterator,_bool>_>
  _Var3;
  TypedID<(spirv_cross::Types)4> local_280;
  TypedID<(spirv_cross::Types)0> local_27c;
  TypedID<(spirv_cross::Types)0> local_278;
  TypedID<(spirv_cross::Types)0> local_274;
  _Node_iterator_base<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)4>,_spirv_cross::SPIREntryPoint>,_true>
  local_270;
  undefined1 local_268;
  pair<unsigned_int,_spirv_cross::SPIREntryPoint> local_260;
  TypedID<(spirv_cross::Types)4> local_154;
  undefined1 local_150 [8];
  SPIREntryPoint proxy_ep;
  undefined1 local_58 [8];
  Instruction ix;
  SPIRBlock *wrapped_entry;
  SPIRFunction *local_38;
  SPIRFunction *wrapped_main;
  uint32_t local_28;
  uint32_t ret_id;
  uint32_t block_id;
  uint32_t func_id;
  SPIRFunction *f;
  SPIREntryPoint *ep;
  CompilerMSL *this_local;
  
  ep = (SPIREntryPoint *)this;
  f = (SPIRFunction *)Compiler::get_entry_point((Compiler *)this);
  id = TypedID::operator_cast_to_unsigned_int
                 ((TypedID *)&(this->super_CompilerGLSL).super_Compiler.ir.default_entry_point);
  _block_id = Compiler::get<spirv_cross::SPIRFunction>((Compiler *)this,id);
  ret_id = ParsedIR::increase_bound_by(&(this->super_CompilerGLSL).super_Compiler.ir,3);
  local_28 = ret_id + 1;
  wrapped_main._4_4_ = ret_id + 2;
  local_38 = Compiler::
             set<spirv_cross::SPIRFunction,spirv_cross::TypedID<(spirv_cross::Types)1>&,spirv_cross::TypedID<(spirv_cross::Types)1>&>
                       ((Compiler *)this,ret_id,
                        (TypedID<(spirv_cross::Types)1> *)&(_block_id->super_IVariant).field_0xc,
                        &_block_id->function_type);
  this_00 = &local_38->blocks;
  TypedID<(spirv_cross::Types)6>::TypedID
            ((TypedID<(spirv_cross::Types)6> *)((long)&wrapped_entry + 4),local_28);
  SmallVector<spirv_cross::TypedID<(spirv_cross::Types)6>,_8UL>::push_back
            (this_00,(TypedID<(spirv_cross::Types)6> *)((long)&wrapped_entry + 4));
  TypedID<(spirv_cross::Types)6>::TypedID((TypedID<(spirv_cross::Types)6> *)&wrapped_entry,local_28)
  ;
  (local_38->entry_block).id = (uint32_t)wrapped_entry;
  register0x00000000 = Compiler::set<spirv_cross::SPIRBlock>((Compiler *)this,local_28);
  *(undefined4 *)&(register0x00000000->super_IVariant).field_0xc = 4;
  ix.op = 0;
  ix.count = 0;
  local_58._0_2_ = 0;
  local_58._2_2_ = 0;
  local_58._4_4_ = 0;
  Instruction::Instruction((Instruction *)local_58);
  local_58._0_2_ = 0x39;
  this_02 = &(this->super_CompilerGLSL).super_Compiler.ir.spirv;
  sVar1 = ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(this_02);
  local_58._4_4_ = (uint32_t)sVar1;
  ix.op = 3;
  ix.count = 0;
  proxy_ep._236_4_ =
       TypedID::operator_cast_to_unsigned_int((TypedID *)&(_block_id->super_IVariant).field_0xc);
  ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
            (this_02,(value_type_conflict1 *)&proxy_ep.geometry_passthrough);
  ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
            (this_02,(value_type_conflict1 *)((long)&wrapped_main + 4));
  proxy_ep.model = TypedID::operator_cast_to_unsigned_int((TypedID *)f);
  ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(this_02,&proxy_ep.model);
  SmallVector<spirv_cross::Instruction,_8UL>::push_back
            (&stack0xffffffffffffffb8->ops,(Instruction *)local_58);
  SPIREntryPoint::SPIREntryPoint((SPIREntryPoint *)local_150,(SPIREntryPoint *)f);
  TypedID<(spirv_cross::Types)4>::TypedID(&local_154,ret_id);
  local_150._0_4_ = local_154.id;
  ::std::make_pair<unsigned_int_const&,spirv_cross::SPIREntryPoint&>
            (&local_260,&ret_id,(SPIREntryPoint *)local_150);
  _Var3 = ::std::
          unordered_map<spirv_cross::TypedID<(spirv_cross::Types)4>,spirv_cross::SPIREntryPoint,std::hash<spirv_cross::TypedID<(spirv_cross::Types)4>>,std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)4>>,std::allocator<std::pair<spirv_cross::TypedID<(spirv_cross::Types)4>const,spirv_cross::SPIREntryPoint>>>
          ::insert<std::pair<unsigned_int,spirv_cross::SPIREntryPoint>>
                    ((unordered_map<spirv_cross::TypedID<(spirv_cross::Types)4>,spirv_cross::SPIREntryPoint,std::hash<spirv_cross::TypedID<(spirv_cross::Types)4>>,std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)4>>,std::allocator<std::pair<spirv_cross::TypedID<(spirv_cross::Types)4>const,spirv_cross::SPIREntryPoint>>>
                      *)&(this->super_CompilerGLSL).super_Compiler.ir.entry_points,&local_260);
  local_270._M_cur =
       (__node_type *)
       _Var3.first.
       super__Node_iterator_base<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)4>,_spirv_cross::SPIREntryPoint>,_true>
       ._M_cur;
  local_268 = _Var3.second;
  ::std::pair<unsigned_int,_spirv_cross::SPIREntryPoint>::~pair(&local_260);
  TypedID<(spirv_cross::Types)0>::TypedID<(spirv_cross::Types)4>
            (&local_274,&(this->super_CompilerGLSL).super_Compiler.ir.default_entry_point);
  pmVar2 = ::std::
           unordered_map<spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>_>
           ::operator[](&(this->super_CompilerGLSL).super_Compiler.ir.meta,&local_274);
  TypedID<(spirv_cross::Types)0>::TypedID(&local_278,ret_id);
  this_01 = ::std::
            unordered_map<spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>_>
            ::operator[](&(this->super_CompilerGLSL).super_Compiler.ir.meta,&local_278);
  Meta::operator=(this_01,pmVar2);
  TypedID<(spirv_cross::Types)0>::TypedID<(spirv_cross::Types)4>
            (&local_27c,&(this->super_CompilerGLSL).super_Compiler.ir.default_entry_point);
  ::std::
  unordered_map<spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>_>
  ::operator[](&(this->super_CompilerGLSL).super_Compiler.ir.meta,&local_27c);
  ::std::__cxx11::string::clear();
  TypedID<(spirv_cross::Types)4>::TypedID(&local_280,ret_id);
  (this->super_CompilerGLSL).super_Compiler.ir.default_entry_point.id = local_280.id;
  SPIREntryPoint::~SPIREntryPoint((SPIREntryPoint *)local_150);
  return;
}

Assistant:

void CompilerMSL::emit_mesh_entry_point()
{
	auto &ep = get_entry_point();
	auto &f = get<SPIRFunction>(ir.default_entry_point);

	const uint32_t func_id = ir.increase_bound_by(3);
	const uint32_t block_id = func_id + 1;
	const uint32_t ret_id = func_id + 2;
	auto &wrapped_main = set<SPIRFunction>(func_id, f.return_type, f.function_type);

	wrapped_main.blocks.push_back(block_id);
	wrapped_main.entry_block = block_id;

	auto &wrapped_entry = set<SPIRBlock>(block_id);
	wrapped_entry.terminator = SPIRBlock::Return;

	// Push call to original 'main'
	Instruction ix = {};
	ix.op = OpFunctionCall;
	ix.offset = uint32_t(ir.spirv.size());
	ix.length = 3;

	ir.spirv.push_back(f.return_type);
	ir.spirv.push_back(ret_id);
	ir.spirv.push_back(ep.self);

	wrapped_entry.ops.push_back(ix);

	// relace entry-point for new one
	SPIREntryPoint proxy_ep = ep;
	proxy_ep.self = func_id;
	ir.entry_points.insert(std::make_pair(func_id, proxy_ep));
	ir.meta[func_id] = ir.meta[ir.default_entry_point];
	ir.meta[ir.default_entry_point].decoration.alias.clear();

	ir.default_entry_point = func_id;
}